

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmosSyncChannel_Mixer.cpp
# Opt level: O3

AtmosSyncChannelMixer * __thiscall
ASDCP::AtmosSyncChannelMixer::MixInSilenceChannels(AtmosSyncChannelMixer *this)

{
  iterator __position;
  SilenceDataProvider *this_00;
  int iVar1;
  uint uVar2;
  long in_RSI;
  AudioDescriptor tmpDesc;
  pair<unsigned_int,_ASDCP::PCMDataProviderInterface_*> local_c0 [6];
  undefined8 local_58;
  undefined8 uStack_50;
  int local_44;
  int local_3c;
  
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  local_58 = 0;
  uStack_50 = 0;
  iVar1 = *(int *)(in_RSI + 0x78) + -0xd;
  if (iVar1 != 0) {
    this_00 = (SilenceDataProvider *)operator_new(0x40);
    uVar2 = -iVar1;
    SilenceDataProvider::SilenceDataProvider
              (this_00,(ui16_t)uVar2,*(ui16_t *)(in_RSI + 0x60),*(ui32_t *)(in_RSI + 0x50),
               (Rational *)(in_RSI + 0x48));
    (*(this_00->super_PCMDataProviderInterface)._vptr_PCMDataProviderInterface[4])
              (local_c0,this_00,&local_58);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_c0);
    Kumu::Result_t::~Result_t((Result_t *)local_c0);
    if (*(int *)&this->_vptr_AtmosSyncChannelMixer < 0) {
      (*(this_00->super_PCMDataProviderInterface)._vptr_PCMDataProviderInterface[1])(this_00);
    }
    else {
      *(int *)(in_RSI + 100) = *(int *)(in_RSI + 100) + local_3c;
      *(int *)(in_RSI + 0x78) = *(int *)(in_RSI + 0x78) + local_44;
      local_c0[0].first = uVar2;
      __position._M_current =
           *(pair<unsigned_int,_ASDCP::PCMDataProviderInterface_*> **)(in_RSI + 0x28);
      local_c0[0].second = (PCMDataProviderInterface *)this_00;
      if (__position._M_current ==
          *(pair<unsigned_int,_ASDCP::PCMDataProviderInterface_*> **)(in_RSI + 0x30)) {
        std::
        vector<std::pair<unsigned_int,ASDCP::PCMDataProviderInterface*>,std::allocator<std::pair<unsigned_int,ASDCP::PCMDataProviderInterface*>>>
        ::_M_realloc_insert<std::pair<unsigned_int,ASDCP::PCMDataProviderInterface*>>
                  ((vector<std::pair<unsigned_int,ASDCP::PCMDataProviderInterface*>,std::allocator<std::pair<unsigned_int,ASDCP::PCMDataProviderInterface*>>>
                    *)(in_RSI + 0x20),__position,local_c0);
      }
      else {
        (__position._M_current)->first = uVar2;
        *(undefined4 *)&(__position._M_current)->field_0x4 = local_c0[0]._4_4_;
        (__position._M_current)->second = (PCMDataProviderInterface *)this_00;
        *(long *)(in_RSI + 0x28) = *(long *)(in_RSI + 0x28) + 0x10;
      }
      local_c0[0]._0_8_ = this_00;
      std::vector<ASDCP::PCMDataProviderInterface*,std::allocator<ASDCP::PCMDataProviderInterface*>>
      ::emplace_back<ASDCP::PCMDataProviderInterface*>
                ((vector<ASDCP::PCMDataProviderInterface*,std::allocator<ASDCP::PCMDataProviderInterface*>>
                  *)(in_RSI + 8),(PCMDataProviderInterface **)local_c0);
      if (*(int *)(in_RSI + 0x78) != 0xd) {
        __assert_fail("m_ChannelCount == (ATMOS::SYNC_CHANNEL - 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AtmosSyncChannel_Mixer.cpp"
                      ,0xe6,"Result_t ASDCP::AtmosSyncChannelMixer::MixInSilenceChannels()");
      }
    }
  }
  return this;
}

Assistant:

Result_t
ASDCP::AtmosSyncChannelMixer::MixInSilenceChannels()
{
  Result_t result = RESULT_OK;
  PCM::AudioDescriptor tmpDesc;
  ui32_t numSilenceChannels = ATMOS::SYNC_CHANNEL - m_ChannelCount - 1;
  if (numSilenceChannels > 0)
  {
    mem_ptr<SilenceDataProvider> I = new SilenceDataProvider(numSilenceChannels,
                                                             m_ADesc.QuantizationBits,
                                                             m_ADesc.AudioSamplingRate.Numerator,
                                                             m_ADesc.EditRate);
    result = I->FillAudioDescriptor(tmpDesc);
    if ( ASDCP_SUCCESS(result) )
    {
      m_ADesc.BlockAlign += tmpDesc.BlockAlign;
      m_ChannelCount += tmpDesc.ChannelCount;
      m_outputs.push_back(std::make_pair(numSilenceChannels, I.get()));
      m_inputs.push_back(I);
      I.release();
      assert(m_ChannelCount == (ATMOS::SYNC_CHANNEL - 1));
    }
  }
  return result;
}